

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

bool nite::keyboardCheck(uint key)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = SDL_GetScancodeFromKey(niteKeys[key]);
  if (keyboardCheck(unsigned_int)::state == '\0') {
    iVar2 = __cxa_guard_acquire(&keyboardCheck(unsigned_int)::state);
    if (iVar2 != 0) {
      keyboardCheck::state = (Uint8 *)SDL_GetKeyboardState(0);
      __cxa_guard_release(&keyboardCheck(unsigned_int)::state);
    }
  }
  if (key < 100) {
    bVar3 = keyboardCheck::state[uVar1] != '\0';
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool nite::keyboardCheck(unsigned key){
	SDL_Scancode k = SDL_GetScancodeFromKey(niteKeys[key]);
	static const Uint8 *state = SDL_GetKeyboardState(NULL);
	return (key >= niteKeysn-1 ? 0 : state[k]);
}